

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteMessageDocComment
               (Printer *printer,Descriptor *message,Options *options,bool kdoc)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  java *pjVar4;
  string_view input;
  string_view input_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  SourceLocation location;
  Options local_c0;
  Options local_70;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_c0,options);
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  pcVar3 = (char *)0x0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  location.trailing_comments._M_dataplus._M_p = (pointer)&location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Descriptor::GetSourceLocation(message,&location);
  if (bVar2) {
    Options::Options(&local_70,&local_c0);
    pcVar3 = (char *)(ulong)kdoc;
    WriteDocCommentBodyForLocation(printer,&location,&local_70,kdoc);
    Options::~Options(&local_70);
  }
  SourceLocation::~SourceLocation(&location);
  Options::~Options(&local_c0);
  if (kdoc) {
    pcVar1 = (message->all_names_).payload_;
    pjVar4 = (java *)(ulong)*(ushort *)(pcVar1 + 2);
    input._M_len = pcVar1 + ~(ulong)pjVar4;
    input._M_str = pcVar3;
    EscapeKdoc_abi_cxx11_((string *)&location,pjVar4,input);
    text_00._M_str = " * Protobuf type `$fullname$`\n */\n";
    text_00._M_len = 0x22;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_00,(char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location);
  }
  else {
    pcVar1 = (message->all_names_).payload_;
    pjVar4 = (java *)(ulong)*(ushort *)(pcVar1 + 2);
    input_00._M_len = pcVar1 + ~(ulong)pjVar4;
    input_00._M_str = pcVar3;
    EscapeJavadoc_abi_cxx11_((string *)&location,pjVar4,input_00);
    text_01._M_str = " * Protobuf type {@code $fullname$}\n */\n";
    text_01._M_len = 0x28;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_01,(char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location);
  }
  std::__cxx11::string::~string((string *)&location);
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message,
                            const Options options, const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message, options, kdoc);
  if (kdoc) {
    printer->Print(
        " * Protobuf type `$fullname$`\n"
        " */\n",
        "fullname", EscapeKdoc(message->full_name()));
  } else {
    printer->Print(
        " * Protobuf type {@code $fullname$}\n"
        " */\n",
        "fullname", EscapeJavadoc(message->full_name()));
  }
}